

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

void __thiscall IDisk::DumpTrack(IDisk *this,int side,uint track,int rev)

{
  ulong uVar1;
  MFMTrack *pMVar2;
  ILog *pIVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  char cVar13;
  
  uVar12 = 0;
  if (this->side_[side].tracks[track].size == 0) {
    cVar13 = '\0';
  }
  else {
    cVar13 = '\0';
    do {
      lVar5 = 0;
      bVar4 = true;
      do {
        bVar7 = bVar4;
        pMVar2 = this->side_[side].tracks;
        uVar6 = (ulong)pMVar2[track].size;
        lVar9 = 0;
        bVar8 = 0;
        uVar10 = lVar5 + (ulong)uVar12;
        do {
          uVar1 = lVar5 + (ulong)uVar12 + lVar9;
          if (uVar1 < uVar6) {
            bVar11 = pMVar2[track].bitfield[uVar10 & 0xffffffff] & 1;
          }
          else {
            bVar11 = 0;
          }
          bVar8 = bVar8 * '\x02' | bVar11;
          cVar13 = (cVar13 + '\x01') - (uVar1 < uVar6);
          lVar9 = lVar9 + 1;
          uVar10 = uVar10 + 2;
        } while (lVar9 != 8);
        pIVar3 = this->log_;
        if (pIVar3 != (ILog *)0x0) {
          (**(code **)(*(long *)pIVar3 + 8))(pIVar3,bVar8);
        }
        lVar5 = 8;
        bVar4 = false;
      } while (bVar7);
      uVar12 = uVar12 + 0x10;
    } while (uVar12 < this->side_[side].tracks[track].size);
  }
  if (this->log_ != (ILog *)0x0) {
    (**(code **)(*(long *)this->log_ + 0x20))();
    pIVar3 = this->log_;
    if (pIVar3 != (ILog *)0x0) {
      (**(code **)(*(long *)pIVar3 + 8))(pIVar3,cVar13);
      return;
    }
  }
  return;
}

Assistant:

void IDisk::DumpTrack(int side, unsigned int track, int rev)
{
   unsigned int index = 0;
   int shift = 0;
   while (index < side_[side].tracks[track].size)
   {
      for (int i = 0; i < 2; i++)
      {
         unsigned char byte = 0;
         for (int j = 0; j < 8; j++)
         {
            byte <<= 1;
            unsigned char b = (index + i * 8 + j < side_[side].tracks[track].size)
                                 ? side_[side].tracks[track].bitfield[index + i * 8 + (j * 2)]
                                 : 0;
            byte |= b & 0x1;

            if (index + i * 8 + j >= side_[side].tracks[track]./*Revolution[rev].*/size)
               shift++;
         }
         LOGB(byte)
      }
      index += 16;
   }
   LOGEOL
   LOGB(shift)
}